

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

int __thiscall
CVmObject::inh_prop(CVmObject *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
                   vm_obj_id_t orig_target_obj,vm_obj_id_t defining_obj,vm_obj_id_t *source_obj,
                   uint *argc)

{
  uint uVar1;
  int iVar2;
  code *UNRECOVERED_JUMPTABLE;
  vm_obj_id_t vVar3;
  long *plVar4;
  
  uVar1 = CVmMetaTable::prop_to_vector_idx(G_meta_table_X,metaclass_reg_->meta_reg_idx_,prop);
  if (uVar1 != 0) {
    vVar3 = 0;
    if (G_meta_table_X->table_ != (vm_meta_entry_t *)0x0 &&
        -1 < (long)G_meta_table_X->reverse_map_[metaclass_reg_->meta_reg_idx_]) {
      vVar3 = G_meta_table_X->table_[G_meta_table_X->reverse_map_[metaclass_reg_->meta_reg_idx_]].
              class_obj_;
    }
    *source_obj = vVar3;
    UNRECOVERED_JUMPTABLE = (code *)func_table_[(ulong)uVar1 * 2];
    plVar4 = (long *)((long)&this->_vptr_CVmObject + func_table_[(ulong)uVar1 * 2 + 1]);
    if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
      UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar4 + -1);
    }
    iVar2 = (*UNRECOVERED_JUMPTABLE)(plVar4,self,retval,argc,prop,source_obj);
    return iVar2;
  }
  iVar2 = find_modifier_prop(this,prop,retval,self,orig_target_obj,defining_obj,source_obj,argc);
  return iVar2;
}

Assistant:

int CVmObject::inh_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                        vm_obj_id_t self, vm_obj_id_t orig_target_obj,
                        vm_obj_id_t defining_obj, vm_obj_id_t *source_obj,
                        uint *argc)
{
    uint func_idx;

    /*
     *   We're inheriting.  This is never called from native code, as native
     *   code does its inheriting directly through C++ calls to base class
     *   native code; hence, we can only be called from a byte-code modifier
     *   object.
     *   
     *   First, try looking for a native implementation.  We can reach this
     *   point if a byte-code object overrides an intrinsic method, then
     *   inherits from the byte-code override.  
     */
    func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);
    if (func_idx != 0)
    {
        /* the source object is the 'Object' intrinsic class */
        *source_obj = metaclass_reg_->get_class_obj(vmg0_);

        /* call the native implementation */
        return (this->*func_table_[func_idx])(vmg_ self, retval, argc,
                                              prop, source_obj);
    }

    /*
     *   We didn't find it among the intrinsic methods, so look at the
     *   modifier objects.  
     */
    return find_modifier_prop(vmg_ prop, retval, self, orig_target_obj,
                              defining_obj, source_obj, argc);
}